

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O0

isobusfs_error linux_error_to_isobusfs_error(int linux_err)

{
  int linux_err_local;
  isobusfs_error local_4;
  
  switch(linux_err) {
  case 0:
    local_4 = ISOBUSFS_ERR_SUCCESS;
    break;
  case -0x5a:
    local_4 = ISOBUSFS_ERR_INVALID_REQUESTED_LENGHT;
    break;
  default:
    local_4 = ISOBUSFS_ERR_OTHER;
    break;
  case -0x54:
    local_4 = ISOBUSFS_ERR_MALFORMED_REQUEST;
    break;
  case -0x47:
    local_4 = ISOBUSFS_ERR_TAN_ERR;
    break;
  case -0x26:
    local_4 = ISOBUSFS_ERR_FUNC_NOT_SUPPORTED;
    break;
  case -0x24:
    local_4 = ISOBUSFS_ERR_INVALID_SRC_NAME;
    break;
  case -0x1e:
    local_4 = ISOBUSFS_ERR_VOLUME_NOT_INITIALIZED;
    break;
  case -0x1d:
    local_4 = ISOBUSFS_ERR_END_OF_FILE;
    break;
  case -0x1c:
    local_4 = ISOBUSFS_ERR_NO_SPACE;
    break;
  case -0x18:
    local_4 = ISOBUSFS_ERR_TOO_MANY_FILES_OPEN;
    break;
  case -0x16:
    local_4 = ISOBUSFS_ERR_INVALID_DST_NAME;
    break;
  case -0x14:
    local_4 = ISOBUSFS_ERR_INVALID_ACCESS;
    break;
  case -0x13:
    local_4 = ISOBUSFS_ERR_MEDIA_IS_NOT_PRESENT;
    break;
  case -0xe:
    local_4 = ISOBUSFS_ERR_ON_READ;
    break;
  case -0xd:
    local_4 = ISOBUSFS_ERR_ACCESS_DENIED;
    break;
  case -0xc:
    local_4 = ISOBUSFS_ERR_OUT_OF_MEM;
    break;
  case -9:
    local_4 = ISOBUSFS_ERR_INVALID_HANDLE;
    break;
  case -5:
    local_4 = ISOBUSFS_ERR_ON_WRITE;
    break;
  case -2:
    local_4 = ISOBUSFS_ERR_FILE_ORPATH_NOT_FOUND;
    break;
  case -1:
    local_4 = ISOBUSFS_ERR_OTHER;
  }
  return local_4;
}

Assistant:

enum isobusfs_error linux_error_to_isobusfs_error(int linux_err)
{
	switch (linux_err) {
	case 0:
		return ISOBUSFS_ERR_SUCCESS;
	case -EINVAL:
		return ISOBUSFS_ERR_INVALID_DST_NAME;
	case -EACCES:
		return ISOBUSFS_ERR_ACCESS_DENIED;
	case -ENOTDIR:
		return ISOBUSFS_ERR_INVALID_ACCESS;
	case -EMFILE:
		return ISOBUSFS_ERR_TOO_MANY_FILES_OPEN;
	case -ENOENT:
		return ISOBUSFS_ERR_FILE_ORPATH_NOT_FOUND;
	case -EBADF:
		return ISOBUSFS_ERR_INVALID_HANDLE;
	case -ENAMETOOLONG:
		return ISOBUSFS_ERR_INVALID_SRC_NAME;
	case -ENOSPC:
		return ISOBUSFS_ERR_NO_SPACE;
	case -EIO:
		return ISOBUSFS_ERR_ON_WRITE;
	case -ENODEV:
		return ISOBUSFS_ERR_MEDIA_IS_NOT_PRESENT;
	case -EROFS:
		return ISOBUSFS_ERR_VOLUME_NOT_INITIALIZED;
	case -EFAULT:
		return ISOBUSFS_ERR_ON_READ;
	case -ENOSYS:
		return ISOBUSFS_ERR_FUNC_NOT_SUPPORTED;
	case -EMSGSIZE:
		return ISOBUSFS_ERR_INVALID_REQUESTED_LENGHT;
	case -ENOMEM:
		return ISOBUSFS_ERR_OUT_OF_MEM;
	case -EPERM:
		return ISOBUSFS_ERR_OTHER;
	case -ESPIPE:
		return ISOBUSFS_ERR_END_OF_FILE;
	case -EPROTO:
		return ISOBUSFS_ERR_TAN_ERR;
	case -EILSEQ:
		return ISOBUSFS_ERR_MALFORMED_REQUEST;
	default:
		return ISOBUSFS_ERR_OTHER;
	}
}